

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3GenerateRowDelete
               (Parse *pParse,Table *pTab,int iCur,int iRowid,int count,Trigger *pTrigger,int onconf
               )

{
  int iVar1;
  Vdbe *p;
  uint p2;
  u32 uVar2;
  u32 uVar3;
  FKey *pFVar4;
  int p2_00;
  uint iCol;
  bool bVar5;
  
  p = pParse->pVdbe;
  p2 = sqlite3VdbeMakeLabel(p);
  sqlite3VdbeAddOp3(p,0x36,iCur,p2,iRowid);
  p2_00 = 0;
  bVar5 = false;
  if ((pParse->db->flags & 0x40000) != 0) {
    pFVar4 = sqlite3FkReferences(pTab);
    bVar5 = true;
    if (pFVar4 == (FKey *)0x0) {
      bVar5 = pTab->pFKey != (FKey *)0x0;
    }
  }
  if ((pTrigger != (Trigger *)0x0) || (bVar5)) {
    iCol = 0;
    uVar2 = sqlite3TriggerColmask(pParse,pTrigger,(ExprList *)0x0,0,3,pTab,onconf);
    uVar3 = sqlite3FkOldmask(pParse,pTab);
    iVar1 = pParse->nMem;
    p2_00 = iVar1 + 1;
    pParse->nMem = iVar1 + 1 + (int)pTab->nCol;
    sqlite3VdbeAddOp3(p,0xe,iRowid,p2_00,0);
    if (0 < pTab->nCol) {
      do {
        if (((uVar3 | uVar2) == 0xffffffff) || (((uVar3 | uVar2) >> (iCol & 0x1f) & 1) != 0)) {
          sqlite3ExprCodeGetColumnOfTable(p,pTab,iCur,iCol,iCol + iVar1 + 2);
        }
        iCol = iCol + 1;
      } while ((int)iCol < (int)pTab->nCol);
    }
    sqlite3CodeRowTrigger(pParse,pTrigger,0x6a,(ExprList *)0x0,1,pTab,p2_00,onconf,p2);
    sqlite3VdbeAddOp3(p,0x36,iCur,p2,iRowid);
    sqlite3FkCheck(pParse,pTab,p2_00,0);
  }
  if (pTab->pSelect == (Select *)0x0) {
    sqlite3GenerateRowIndexDelete(pParse,pTab,iCur,(int *)0x0);
    sqlite3VdbeAddOp3(p,0x3b,iCur,(uint)(count != 0),0);
    if (count != 0) {
      sqlite3VdbeChangeP4(p,-1,pTab->zName,0);
    }
  }
  sqlite3FkActions(pParse,pTab,(ExprList *)0x0,p2_00);
  sqlite3CodeRowTrigger(pParse,pTrigger,0x6a,(ExprList *)0x0,2,pTab,p2_00,onconf,p2);
  if (p->aLabel != (int *)0x0) {
    p->aLabel[(int)~p2] = p->nOp;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowDelete(
  Parse *pParse,     /* Parsing context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iCur,          /* Cursor number for the table */
  int iRowid,        /* Memory cell that contains the rowid to delete */
  int count,         /* If non-zero, increment the row change counter */
  Trigger *pTrigger, /* List of triggers to (potentially) fire */
  int onconf         /* Default ON CONFLICT policy for triggers */
){
  Vdbe *v = pParse->pVdbe;        /* Vdbe */
  int iOld = 0;                   /* First register in OLD.* array */
  int iLabel;                     /* Label resolved to end of generated code */

  /* Vdbe is guaranteed to have been allocated by this stage. */
  assert( v );

  /* Seek cursor iCur to the row to delete. If this row no longer exists 
  ** (this can happen if a trigger program has already deleted it), do
  ** not attempt to delete it or fire any DELETE triggers.  */
  iLabel = sqlite3VdbeMakeLabel(v);
  sqlite3VdbeAddOp3(v, OP_NotExists, iCur, iLabel, iRowid);
 
  /* If there are any triggers to fire, allocate a range of registers to
  ** use for the old.* references in the triggers.  */
  if( sqlite3FkRequired(pParse, pTab, 0, 0) || pTrigger ){
    u32 mask;                     /* Mask of OLD.* columns in use */
    int iCol;                     /* Iterator used while populating OLD.* */

    /* TODO: Could use temporary registers here. Also could attempt to
    ** avoid copying the contents of the rowid register.  */
    mask = sqlite3TriggerColmask(
        pParse, pTrigger, 0, 0, TRIGGER_BEFORE|TRIGGER_AFTER, pTab, onconf
    );
    mask |= sqlite3FkOldmask(pParse, pTab);
    iOld = pParse->nMem+1;
    pParse->nMem += (1 + pTab->nCol);

    /* Populate the OLD.* pseudo-table register array. These values will be 
    ** used by any BEFORE and AFTER triggers that exist.  */
    sqlite3VdbeAddOp2(v, OP_Copy, iRowid, iOld);
    for(iCol=0; iCol<pTab->nCol; iCol++){
      if( mask==0xffffffff || mask&(1<<iCol) ){
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, iCol, iOld+iCol+1);
      }
    }

    /* Invoke BEFORE DELETE trigger programs. */
    sqlite3CodeRowTrigger(pParse, pTrigger, 
        TK_DELETE, 0, TRIGGER_BEFORE, pTab, iOld, onconf, iLabel
    );

    /* Seek the cursor to the row to be deleted again. It may be that
    ** the BEFORE triggers coded above have already removed the row
    ** being deleted. Do not attempt to delete the row a second time, and 
    ** do not fire AFTER triggers.  */
    sqlite3VdbeAddOp3(v, OP_NotExists, iCur, iLabel, iRowid);

    /* Do FK processing. This call checks that any FK constraints that
    ** refer to this table (i.e. constraints attached to other tables) 
    ** are not violated by deleting this row.  */
    sqlite3FkCheck(pParse, pTab, iOld, 0);
  }

  /* Delete the index and table entries. Skip this step if pTab is really
  ** a view (in which case the only effect of the DELETE statement is to
  ** fire the INSTEAD OF triggers).  */ 
  if( pTab->pSelect==0 ){
    sqlite3GenerateRowIndexDelete(pParse, pTab, iCur, 0);
    sqlite3VdbeAddOp2(v, OP_Delete, iCur, (count?OPFLAG_NCHANGE:0));
    if( count ){
      sqlite3VdbeChangeP4(v, -1, pTab->zName, P4_TRANSIENT);
    }
  }

  /* Do any ON CASCADE, SET NULL or SET DEFAULT operations required to
  ** handle rows (possibly in other tables) that refer via a foreign key
  ** to the row just deleted. */ 
  sqlite3FkActions(pParse, pTab, 0, iOld);

  /* Invoke AFTER DELETE trigger programs. */
  sqlite3CodeRowTrigger(pParse, pTrigger, 
      TK_DELETE, 0, TRIGGER_AFTER, pTab, iOld, onconf, iLabel
  );

  /* Jump here if the row had already been deleted before any BEFORE
  ** trigger programs were invoked. Or if a trigger program throws a 
  ** RAISE(IGNORE) exception.  */
  sqlite3VdbeResolveLabel(v, iLabel);
}